

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsCreators.cpp
# Opt level: O1

void chrono::utils::AddCapsuleGeometry
               (ChBody *body,shared_ptr<chrono::ChMaterialSurface> *material,double radius,
               double hlen,ChVector<double> *pos,ChQuaternion<double> *rot,bool visualization,
               shared_ptr<chrono::ChVisualMaterial> *vis_material)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ChCapsuleShape *this;
  ChBody *model;
  shared_ptr<chrono::ChCapsuleShape> capsule;
  shared_ptr<chrono::ChVisualShape> local_120;
  shared_ptr<chrono::ChVisualMaterial> local_110;
  ChCapsuleShape *local_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f8;
  undefined1 local_f0 [48];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  ChFrame<double> local_b8;
  
  peVar1 = (body->collision_model).
           super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var2 = (body->collision_model).
           super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  local_f0._16_8_ =
       (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_f0._24_8_ =
       (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._24_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._24_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._24_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._24_8_)->_M_use_count + 1;
    }
  }
  local_f0._32_8_ = vis_material;
  ChMatrix33<double>::ChMatrix33((ChMatrix33<double> *)&local_b8,rot);
  (*peVar1->_vptr_ChCollisionModel[0xb])(radius,hlen,peVar1,local_f0 + 0x10,pos,&local_b8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._24_8_);
  }
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if (visualization) {
    model = body;
    ChPhysicsItem::GetVisualModel(&body->super_ChPhysicsItem);
    if ((element_type *)local_b8.coord.pos.m_data[0] != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8.coord.pos.m_data[0]);
    }
    if ((ChSystem *)local_b8._vptr_ChFrame == (ChSystem *)0x0) {
      p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x40);
      p_Var2->_M_use_count = 1;
      p_Var2->_M_weak_count = 1;
      p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b33b18;
      local_f0._0_8_ = p_Var2 + 1;
      p_Var2[1]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var2[1]._M_use_count = 0;
      p_Var2[1]._M_weak_count = 0;
      p_Var2[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var2[2]._M_use_count = 0;
      p_Var2[2]._M_weak_count = 0;
      p_Var2[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var2[2]._M_use_count = 0;
      p_Var2[2]._M_weak_count = 0;
      p_Var2[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var2[3]._M_use_count = 0;
      p_Var2[3]._M_weak_count = 0;
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = 2;
      }
      model = (ChBody *)local_f0;
      local_f0._8_8_ = p_Var2;
      ChPhysicsItem::AddVisualModel
                (&body->super_ChPhysicsItem,(shared_ptr<chrono::ChVisualModel> *)model);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._8_8_);
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    this = (ChCapsuleShape *)ChVisualShape::operator_new((ChVisualShape *)0x40,(size_t)model);
    ChCapsuleShape::ChCapsuleShape(this);
    local_100 = this;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChCapsuleShape*>
              (&local_f8,this);
    (local_100->gcapsule).rad = radius;
    (local_100->gcapsule).hlen = hlen;
    local_110.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)local_f0._32_8_;
    local_110.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f0._32_8_ + 8))->_M_pi;
    if (local_110.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_110.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_110.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_110.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_110.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    ChVisualShape::AddMaterial(&local_100->super_ChVisualShape,&local_110);
    if (local_110.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_110.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    ChPhysicsItem::GetVisualModel(&body->super_ChPhysicsItem);
    local_120.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_100->super_ChVisualShape;
    local_120.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = local_f8._M_pi;
    if (local_f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_f8._M_pi)->_M_use_count = (local_f8._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_f8._M_pi)->_M_use_count = (local_f8._M_pi)->_M_use_count + 1;
      }
    }
    local_b8._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
    local_b8.coord.pos.m_data[0] = pos->m_data[0];
    local_b8.coord.pos.m_data[1] = pos->m_data[1];
    local_b8.coord.pos.m_data[2] = pos->m_data[2];
    local_b8.coord.rot.m_data[0] = rot->m_data[0];
    local_b8.coord.rot.m_data[1] = rot->m_data[1];
    local_b8.coord.rot.m_data[2] = rot->m_data[2];
    local_b8.coord.rot.m_data[3] = rot->m_data[3];
    ChMatrix33<double>::ChMatrix33(&local_b8.Amatrix,rot);
    ChVisualModel::AddShape((ChVisualModel *)local_f0._40_8_,&local_120,&local_b8);
    if (local_120.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_120.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
    }
    if (local_f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8._M_pi);
    }
  }
  return;
}

Assistant:

void AddCapsuleGeometry(ChBody* body,
                        std::shared_ptr<ChMaterialSurface> material,
                        double radius,
                        double hlen,
                        const ChVector<>& pos,
                        const ChQuaternion<>& rot,
                        bool visualization,
                        std::shared_ptr<ChVisualMaterial> vis_material) {
    body->GetCollisionModel()->AddCapsule(material, radius, hlen, pos, rot);

    if (visualization) {
        if (!body->GetVisualModel()) {
            auto model = chrono_types::make_shared<ChVisualModel>();
            body->AddVisualModel(model);
        }
        auto capsule = chrono_types::make_shared<ChCapsuleShape>();
        capsule->GetCapsuleGeometry().rad = radius;
        capsule->GetCapsuleGeometry().hlen = hlen;
        capsule->AddMaterial(vis_material);
        body->GetVisualModel()->AddShape(capsule, ChFrame<>(pos, rot));
    }
}